

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

bool __thiscall QFileSystemModel::hasChildren(QFileSystemModel *this,QModelIndex *parent)

{
  QFileSystemModelPrivate *this_00;
  bool bVar1;
  bool bVar2;
  QFileSystemNode *this_01;
  
  if (parent->c < 1) {
    this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
    bVar2 = QModelIndex::isValid(parent);
    bVar1 = true;
    if (bVar2) {
      this_01 = QFileSystemModelPrivate::node(this_00,parent);
      bVar2 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_01);
      return bVar2;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QFileSystemModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return false;

    if (!parent.isValid()) // drives
        return true;

    const QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    Q_ASSERT(indexNode);
    return (indexNode->isDir());
}